

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O3

bool dxil_spv::analyze_extractvalue_instruction(Impl *impl,ExtractValueInst *inst)

{
  bool bVar1;
  uint uVar2;
  TypeID TVar3;
  Value *pVVar4;
  Type *this;
  mapped_type *pmVar5;
  uint *puVar6;
  Value *local_28;
  
  uVar2 = LLVMBC::ExtractValueInst::getNumIndices(inst);
  if (uVar2 == 1) {
    pVVar4 = LLVMBC::ExtractValueInst::getAggregateOperand(inst);
    this = LLVMBC::Value::getType(pVVar4);
    TVar3 = LLVMBC::Type::getTypeID(this);
    if (TVar3 == StructTyID) {
      local_28 = LLVMBC::ExtractValueInst::getAggregateOperand(inst);
      pmVar5 = std::__detail::
               _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&impl->llvm_composite_meta,&local_28);
      puVar6 = LLVMBC::ExtractValueInst::getIndices(inst);
      uVar2 = *puVar6;
      pmVar5->access_mask = pmVar5->access_mask | 1 << ((byte)uVar2 & 0x1f);
      if (pmVar5->components <= uVar2) {
        pmVar5->components = uVar2 + 1;
      }
      pVVar4 = LLVMBC::ExtractValueInst::getAggregateOperand(inst);
      bVar1 = instruction_is_ballot(pVVar4);
      if (bVar1) {
        if (uVar2 == 0) {
          (impl->shader_analysis).subgroup_ballot_reads_first = true;
        }
        else {
          (impl->shader_analysis).subgroup_ballot_reads_upper = true;
        }
      }
    }
  }
  return true;
}

Assistant:

bool analyze_extractvalue_instruction(Converter::Impl &impl, const llvm::ExtractValueInst *inst)
{
	if (inst->getNumIndices() == 1 &&
	    inst->getAggregateOperand()->getType()->getTypeID() == llvm::Type::TypeID::StructTyID)
	{
		auto &meta = impl.llvm_composite_meta[inst->getAggregateOperand()];
		unsigned index = inst->getIndices()[0];
		meta.access_mask |= 1u << index;
		if (index >= meta.components)
			meta.components = index + 1;

		if (instruction_is_ballot(inst->getAggregateOperand()))
		{
			if (index == 0)
				impl.shader_analysis.subgroup_ballot_reads_first = true;
			else
				impl.shader_analysis.subgroup_ballot_reads_upper = true;
		}
	}
	return true;
}